

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_SimpleArray<ON_3dex>::Append(ON_SimpleArray<ON_3dex> *this,ON_3dex *x)

{
  int iVar1;
  ON_3dex *pOVar2;
  ON_3dex *memblock;
  int iVar3;
  uint uVar4;
  
  iVar1 = this->m_count;
  memblock = x;
  if (iVar1 == this->m_capacity) {
    if ((iVar1 < 8) || ((ulong)((long)iVar1 * 0xc) < 0x10000001)) {
      uVar4 = 4;
      if (2 < iVar1) {
        uVar4 = iVar1 * 2;
      }
    }
    else {
      iVar3 = 0x155555d;
      if (iVar1 < 0x155555d) {
        iVar3 = iVar1;
      }
      uVar4 = iVar3 + iVar1;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_3dex *)onmalloc(0xc);
      iVar1 = x->j;
      memblock->i = x->i;
      memblock->j = iVar1;
      memblock->k = x->k;
    }
    if ((uint)this->m_capacity < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
    if (this->m_a == (ON_3dex *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pOVar2 = this->m_a;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  pOVar2[iVar1].k = memblock->k;
  iVar3 = memblock->j;
  pOVar2 = pOVar2 + iVar1;
  pOVar2->i = memblock->i;
  pOVar2->j = iVar3;
  if (memblock != x) {
    onfree(memblock);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}